

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_object.cpp
# Opt level: O2

string * __thiscall
mjs::not_callable_exception::format_error_message_abi_cxx11_
          (string *__return_storage_ptr__,not_callable_exception *this,value *v)

{
  gc_heap_ptr_untyped *this_00;
  ostringstream oss;
  undefined1 auStack_198 [392];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(auStack_198 + 0x10));
  if (*(value_type *)this == object) {
    this_00 = &value::object_value((value *)this)->super_gc_heap_ptr_untyped;
    gc_heap_ptr_untyped::get(this_00);
    object::class_name((object *)auStack_198);
    mjs::operator<<((ostream *)(auStack_198 + 0x10),(string *)auStack_198);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)auStack_198);
  }
  else {
    mjs::operator<<((basic_ostream<char,_std::char_traits<char>_> *)(auStack_198 + 0x10),
                    *(value_type *)this);
  }
  std::operator<<((ostream *)(auStack_198 + 0x10)," is not a function");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(auStack_198 + 0x10));
  return __return_storage_ptr__;
}

Assistant:

std::string not_callable_exception::format_error_message(const value& v) {
    std::ostringstream oss;
    if (v.type() == value_type::object) {
        oss << v.object_value()->class_name();
    } else {
        oss << v.type();
    }
    oss << " is not a function";
    return oss.str();
}